

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_cast.hpp
# Opt level: O0

bool duckdb::TryCastWithOverflowCheck<unsigned_long,unsigned_char>
               (unsigned_long value,uchar *result)

{
  bool bVar1;
  byte bVar2;
  undefined1 *in_RSI;
  unsigned_long in_RDI;
  
  bVar1 = Value::IsFinite<unsigned_long>(in_RDI);
  if (((bVar1) && (bVar2 = NumericLimits<unsigned_char>::Minimum(), bVar2 <= in_RDI)) &&
     (bVar2 = NumericLimits<unsigned_char>::Maximum(), in_RDI <= bVar2)) {
    *in_RSI = (char)in_RDI;
    return true;
  }
  return false;
}

Assistant:

static bool TryCastWithOverflowCheck(SRC value, DST &result) {
	if (!Value::IsFinite<SRC>(value)) {
		return false;
	}
	if (NumericLimits<SRC>::IsSigned() != NumericLimits<DST>::IsSigned()) {
		if (NumericLimits<SRC>::IsSigned()) {
			// signed to unsigned conversion
			if (NumericLimits<SRC>::Digits() > NumericLimits<DST>::Digits()) {
				if (value < 0 || value > (SRC)NumericLimits<DST>::Maximum()) {
					return false;
				}
			} else {
				if (value < 0) {
					return false;
				}
			}
			result = (DST)value;
			return true;
		} else {
			// unsigned to signed conversion
			if (NumericLimits<SRC>::Digits() >= NumericLimits<DST>::Digits()) {
				if (value <= (SRC)NumericLimits<DST>::Maximum()) {
					result = (DST)value;
					return true;
				}
				return false;
			} else {
				result = (DST)value;
				return true;
			}
		}
	} else {
		// same sign conversion
		if (NumericLimits<DST>::Digits() >= NumericLimits<SRC>::Digits()) {
			result = (DST)value;
			return true;
		} else {
			if (value < SRC(NumericLimits<DST>::Minimum()) || value > SRC(NumericLimits<DST>::Maximum())) {
				return false;
			}
			result = (DST)value;
			return true;
		}
	}
}